

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCoberturaCoverage.cxx
# Opt level: O3

void __thiscall
cmParseCoberturaCoverage::XMLParser::XMLParser
          (XMLParser *this,cmCTest *ctest,cmCTestCoverageHandlerContainer *cont)

{
  cmXMLParser::cmXMLParser(&this->super_cmXMLParser);
  (this->super_cmXMLParser)._vptr_cmXMLParser = (_func_int **)&PTR__XMLParser_006b58e8;
  (this->FilePaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FilePaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FilePaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->CTest = ctest;
  this->Coverage = cont;
  (this->CurFileName)._M_dataplus._M_p = (pointer)&(this->CurFileName).field_2;
  (this->CurFileName)._M_string_length = 0;
  (this->CurFileName).field_2._M_local_buf[0] = '\0';
  this->InSources = false;
  this->InSource = false;
  this->SkipThisClass = false;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->FilePaths,&cont->SourceDir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->FilePaths,&this->Coverage->BinaryDir);
  std::__cxx11::string::_M_replace
            ((ulong)&this->CurFileName,0,(char *)(this->CurFileName)._M_string_length,0x5e12e9);
  return;
}

Assistant:

XMLParser(cmCTest* ctest, cmCTestCoverageHandlerContainer& cont)
    : CTest(ctest), Coverage(cont)
  {
   this->InSources     = false;
   this->InSource      = false;
   this->SkipThisClass = false;
   this->FilePaths.push_back(this->Coverage.SourceDir);
   this->FilePaths.push_back(this->Coverage.BinaryDir);
   this->CurFileName = "";
  }